

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O0

BOOL PAL_HasEntered(void)

{
  BOOL BVar1;
  CPalThread *this;
  CPalThread *pThread;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  this = CorUnix::InternalGetCurrentThread();
  if (this == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_HasEntered",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
            ,0xc4);
    fprintf(_stderr,"PAL_Reenter called on a thread unknown to this PAL\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  BVar1 = CorUnix::CPalThread::IsInPal(this);
  return BVar1;
}

Assistant:

BOOL
PALAPI
PAL_HasEntered()
{
    ENTRY_EXTERNAL("PAL_HasEntered()\n");

    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread == NULL)
    {
        ASSERT("PAL_Reenter called on a thread unknown to this PAL\n");
    }

    LOGEXIT("PAL_HasEntered returned\n");

    return pThread->IsInPal();
}